

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabbar.cpp
# Opt level: O3

void QTabBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  int iVar2;
  QSize *pQVar3;
  code *pcVar4;
  TextElideMode TVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  TextElideMode *pTVar9;
  QSize QVar10;
  long lVar11;
  ushort uVar12;
  QTabBarPrivate *pQVar13;
  long in_FS_OFFSET;
  undefined4 local_40;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_3c = *_a[1];
      iVar8 = 0;
      break;
    case 1:
      local_3c = *_a[1];
      iVar8 = 1;
      break;
    case 2:
      local_3c = *_a[1];
      local_40 = *_a[2];
      local_28 = &local_40;
      iVar8 = 2;
      break;
    case 3:
      local_3c = *_a[1];
      iVar8 = 3;
      break;
    case 4:
      local_3c = *_a[1];
      iVar8 = 4;
      break;
    case 5:
      pTVar9 = (TextElideMode *)_a[1];
switchD_0048ff58_caseD_1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentIndex((QTabBar *)_o,*pTVar9);
        return;
      }
      goto LAB_00490476;
    default:
      goto switchD_0048feef_caseD_3;
    }
    local_30 = &local_3c;
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar8,&local_38);
    goto switchD_0048feef_caseD_3;
  case ReadProperty:
    if (0xd < (uint)_id) goto switchD_0048feef_caseD_3;
    break;
  case WriteProperty:
    if (0xd < (uint)_id) goto switchD_0048feef_caseD_3;
    pTVar9 = (TextElideMode *)*_a;
    switch(_id) {
    case 0:
      pQVar13 = *(QTabBarPrivate **)(_o + 8);
      if (pQVar13->shape != *pTVar9) {
        pQVar13->shape = *pTVar9;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) goto LAB_00490188;
        goto LAB_00490476;
      }
      break;
    case 1:
      goto switchD_0048ff58_caseD_1;
    case 3:
      uVar7 = *(ushort *)(*(long *)(_o + 8) + 0x2d0);
      if (((uVar7 & 2) == 0) == (bool)(char)*pTVar9) {
        *(ushort *)(*(long *)(_o + 8) + 0x2d0) = (uVar7 & 0xfffd) + (ushort)(byte)(char)*pTVar9 * 2;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWidget::update((QWidget *)_o);
          return;
        }
        goto LAB_00490476;
      }
      break;
    case 4:
      lVar11 = *(long *)(_o + 8);
      *(undefined8 *)(lVar11 + 0x27c) = *(undefined8 *)pTVar9;
      pbVar1 = (byte *)(lVar11 + 0x2d0);
      *pbVar1 = *pbVar1 | 1;
      QWidget::update((QWidget *)_o);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidget::updateGeometry((QWidget *)_o);
        return;
      }
      goto LAB_00490476;
    case 5:
      pQVar13 = *(QTabBarPrivate **)(_o + 8);
      pQVar13->elideMode = *pTVar9;
      pQVar13->field_0x2d0 = pQVar13->field_0x2d0 | 4;
      QHash<QString,_QSize>::clear(&pQVar13->textSizes);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_00490188:
        QTabBarPrivate::refresh(pQVar13);
        return;
      }
      goto LAB_00490476;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setUsesScrollButtons((QTabBar *)_o,SUB41(*pTVar9,0));
        return;
      }
      goto LAB_00490476;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setTabsClosable((QTabBar *)_o,SUB41(*pTVar9,0));
        return;
      }
      goto LAB_00490476;
    case 8:
      *(TextElideMode *)(*(long *)(_o + 8) + 0x2b0) = *pTVar9;
      break;
    case 9:
      pQVar13 = *(QTabBarPrivate **)(_o + 8);
      if (((*(ushort *)&pQVar13->field_0x2d0 & 0x20) == 0) == (bool)(char)*pTVar9) {
        *(ushort *)&pQVar13->field_0x2d0 =
             *(ushort *)&pQVar13->field_0x2d0 & 0xffdf | (ushort)(byte)(char)*pTVar9 << 5;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QTabBarPrivate::layoutTabs(pQVar13);
          return;
        }
        goto LAB_00490476;
      }
      break;
    case 10:
      lVar11 = *(long *)(_o + 8);
      uVar7 = (ushort)(byte)(char)*pTVar9 << 8;
      uVar12 = 0xfeff;
      goto LAB_00490300;
    case 0xb:
      lVar11 = *(long *)(_o + 8);
      uVar7 = (ushort)(byte)(char)*pTVar9 << 10;
      uVar12 = 0xfbff;
LAB_00490300:
      *(ushort *)(lVar11 + 0x2d0) = uVar12 & (ushort)*(undefined4 *)(lVar11 + 0x2d0) | uVar7;
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setAutoHide((QTabBar *)_o,SUB41(*pTVar9,0));
        return;
      }
      goto LAB_00490476;
    case 0xd:
      TVar5 = *pTVar9;
      lVar11 = *(long *)(_o + 8);
      *(ushort *)(lVar11 + 0x2d0) =
           (ushort)*(undefined4 *)(lVar11 + 0x2d0) & 0xefff | (ushort)(byte)(char)TVar5 << 0xc;
      if ((char)TVar5 == ElideLeft) {
        QBasicTimer::stop();
        *(undefined4 *)(lVar11 + 0x2a4) = 0xffffffff;
      }
    }
  default:
    goto switchD_0048feef_caseD_3;
  case IndexOfMethod:
    pcVar4 = *_a[1];
    lVar11 = *(long *)((long)_a[1] + 8);
    if (pcVar4 == currentChanged && lVar11 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar4 == tabCloseRequested && lVar11 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar4 == tabMoved && lVar11 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar4 == tabBarClicked && lVar11 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar4 == tabBarDoubleClicked && lVar11 == 0) {
      *(undefined4 *)*_a = 4;
    }
    goto switchD_0048feef_caseD_3;
  }
  pQVar3 = (QSize *)*_a;
  switch(_id) {
  case 0:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x2b4);
    break;
  case 1:
    iVar2 = *(int *)(*(long *)(_o + 8) + 700);
    if ((long)iVar2 < 0) {
      iVar8 = -1;
    }
    else {
      iVar8 = -1;
      if ((ulong)(long)iVar2 < *(ulong *)(*(long *)(_o + 8) + 0x2e8)) {
        iVar8 = iVar2;
      }
    }
    break;
  case 2:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x2e8);
    break;
  case 3:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 1;
    goto LAB_0049042c;
  case 4:
    QVar10 = iconSize((QTabBar *)_o);
    *pQVar3 = QVar10;
    goto switchD_0048feef_caseD_3;
  case 5:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x2ac);
    break;
  case 6:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 3;
    goto LAB_0049042c;
  case 7:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 6;
    goto LAB_0049042c;
  case 8:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0x2b0);
    break;
  case 9:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 5;
    goto LAB_0049042c;
  case 10:
    bVar6 = *(byte *)(*(long *)(_o + 8) + 0x2d1);
LAB_0049042c:
    *(byte *)&(pQVar3->wd).m_i = bVar6 & 1;
    goto switchD_0048feef_caseD_3;
  case 0xb:
    bVar6 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 10);
    goto LAB_0049040c;
  case 0xc:
    bVar6 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xb);
    goto LAB_0049040c;
  case 0xd:
    bVar6 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xc);
LAB_0049040c:
    *(byte *)&(pQVar3->wd).m_i = bVar6 & 1;
    goto switchD_0048feef_caseD_3;
  }
  (pQVar3->wd).m_i = iVar8;
switchD_0048feef_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00490476:
  __stack_chk_fail();
}

Assistant:

void QTabBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int , int )>(_a, &QTabBar::tabMoved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarClicked, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarDoubleClicked, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->shape(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->drawBase(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 8: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehaviorOnRemove(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->expanding(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoHide(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->changeCurrentOnDrag(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDrawBase(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setSelectionBehaviorOnRemove(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 9: _t->setExpanding(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setAutoHide(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setChangeCurrentOnDrag(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}